

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering.hpp
# Opt level: O3

Option<Kernel::TermList> __thiscall
Kernel::LAKBO::skeleton(LAKBO *this,Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> *t)

{
  long in_RDX;
  Value extraout_RDX;
  Option<Kernel::TermList> OVar2;
  char local_30 [8];
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_28;
  Value VVar1;
  
  trySkeleton<Lib::IterTraits<Lib::Stack<Kernel::PolyNf>::BottomFirstIterator>>
            ((Option<Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>_>
              *)local_30,(LAKBO *)t,
             (IterTraits<Lib::Stack<Kernel::PolyNf>::BottomFirstIterator>)
             *(BottomFirstIterator *)(*(long *)(in_RDX + 8) + 0x18));
  OVar2 = Lib::
          Option<Lib::Recycled<Lib::Stack<Kernel::TermList>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
          ::
          map<Kernel::LAKBO::skeleton(Lib::Perfect<Kernel::FuncTerm,Lib::PerfectIdComparison>const&)const::_lambda(auto:1)_1_>
                    ((Option<Lib::Recycled<Lib::Stack<Kernel::TermList>,Lib::DefaultReset,Lib::DefaultKeepRecycled>>
                      *)this,(Perfect<Kernel::FuncTerm,_Lib::PerfectIdComparison> *)local_30);
  VVar1 = (Value)OVar2.super_OptionBase<Kernel::TermList>._elem._elem;
  if (local_30[0] == '\x01') {
    Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    ~Recycled(&local_28);
    VVar1 = extraout_RDX;
  }
  OVar2.super_OptionBase<Kernel::TermList>._elem._elem = VVar1;
  OVar2.super_OptionBase<Kernel::TermList>._0_8_ = this;
  return (Option<Kernel::TermList>)OVar2.super_OptionBase<Kernel::TermList>;
}

Assistant:

Option<TermList> skeleton(Perfect<FuncTerm> const& t) const {
    return trySkeleton(t->iterArgs())
      .map([&](auto args) {
          if (t->function().isFloor()) {
            return args[0];
          } else {
            return TermList(Term::createFromIter(
                  t->function().id(),
                  concatIters(
                    t->function().iterTypeArgs(),
                    arrayIter(*args)
                    )));
          }
      });
  }